

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

string * __thiscall
BasePort::PortTypeString_abi_cxx11_(string *__return_storage_ptr__,BasePort *this,PortType portType)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "Firewire";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "Ethernet-UDP";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Ethernet-Raw";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Zynq-EMIO";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string BasePort::PortTypeString(PortType portType)
{
    if (portType == PORT_FIREWIRE)
        return std::string("Firewire");
    else if (portType == PORT_ETH_RAW)
        return std::string("Ethernet-Raw");
    else if (portType == PORT_ETH_UDP)
        return std::string("Ethernet-UDP");
    else if (portType == PORT_ZYNQ_EMIO)
        return std::string("Zynq-EMIO");
    else
        return std::string("Unknown");
}